

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcolumn_bmod.c
# Opt level: O0

int zcolumn_bmod(int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  flops_t *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int_t iVar11;
  doublecomplex *Mxvec;
  double dVar12;
  double dVar13;
  double dVar14;
  int local_244;
  int local_240;
  int local_23c;
  double ci_9;
  double cr_9;
  double ci_8;
  double cr_8;
  double ci_7;
  double cr_7;
  double ci_6;
  double cr_6;
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  flops_t *ops;
  int_t mem_error;
  doublecomplex comp_temp1;
  doublecomplex comp_temp;
  doublecomplex none;
  doublecomplex one;
  doublecomplex zero;
  doublecomplex *tempv1;
  int_t *piStack_128;
  int_t nzlumax;
  int_t *xlusup;
  doublecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int d_fsupc;
  int fst_col;
  int_t nextlu;
  int_t ufirst;
  int_t new_next;
  int_t no_zeros;
  int_t i;
  int_t irow;
  int_t isub;
  int_t kfnz;
  int_t lptr;
  int ksupno;
  int krep_ind;
  int krep;
  int ksub;
  int k;
  int jsupno;
  int jcolp1;
  int nrow;
  int segsze;
  int nsupr;
  int nsupc;
  int fsupc;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  doublecomplex ukj2;
  doublecomplex ukj1;
  doublecomplex ukj;
  doublecomplex beta;
  doublecomplex alpha;
  int incy;
  int incx;
  int *repfnz_local;
  int *segrep_local;
  doublecomplex *tempv_local;
  doublecomplex *dense_local;
  int nseg_local;
  int jcol_local;
  
  memset(&one.i,0,0x10);
  one.r = 0.0;
  pfVar7 = stat->ops;
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  lusup = (doublecomplex *)Glu->xlsub;
  xlusup = (int_t *)Glu->lusup;
  piStack_128 = Glu->xlusup;
  tempv1._4_4_ = Glu->nzlumax;
  k = jcol + 1;
  ksub = lsub[jcol];
  krep = nseg + -1;
  for (krep_ind = 0; krep_ind < nseg; krep_ind = krep_ind + 1) {
    ksupno = segrep[krep];
    krep = krep + -1;
    kfnz = lsub[ksupno];
    if (ksub != kfnz) {
      nsupr = supno[kfnz];
      local_23c = nsupr;
      if (nsupr <= fpanelc) {
        local_23c = fpanelc;
      }
      xsup._4_4_ = local_23c;
      xsup._0_4_ = local_23c - nsupr;
      iVar8 = piStack_128[local_23c] + (int)xsup;
      isub = *(int *)((long)&lusup->r + (long)nsupr * 4) + (int)xsup;
      local_240 = repfnz[ksupno];
      if (local_240 <= fpanelc) {
        local_240 = fpanelc;
      }
      irow = local_240;
      jcolp1 = (ksupno - local_240) + 1;
      iVar9 = ksupno - local_23c;
      segsze = iVar9 + 1;
      nrow = *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4) -
             *(int *)((long)&lusup->r + (long)nsupr * 4);
      jsupno = (nrow - (int)xsup) - segsze;
      iVar10 = isub + segsze;
      lptr = iVar10 + -1;
      pfVar7[0x13] = (float)(jcolp1 * 4 * (ksupno - local_240)) + pfVar7[0x13];
      pfVar7[0x14] = (float)(jsupno * 8 * jcolp1) + pfVar7[0x14];
      if (jcolp1 == 1) {
        dVar12 = dense[xlsub[lptr]].r;
        dVar13 = dense[xlsub[lptr]].i;
        luptr2 = nrow * iVar9 + segsze + iVar8;
        for (new_next = isub + segsze; new_next < *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4);
            new_next = new_next + 1) {
          no_zeros = xlsub[new_next];
          dVar14 = *(double *)(xlusup + (long)luptr2 * 4);
          dVar1 = *(double *)(xlusup + (long)luptr2 * 4 + 2);
          dense[no_zeros].r =
               dense[no_zeros].r -
               (dVar12 * *(double *)(xlusup + (long)luptr2 * 4) +
               -(dVar13 * *(double *)(xlusup + (long)luptr2 * 4 + 2)));
          dense[no_zeros].i = dense[no_zeros].i - (dVar13 * dVar14 + dVar12 * dVar1);
          luptr2 = luptr2 + 1;
        }
      }
      else if (jcolp1 < 4) {
        dVar12 = dense[xlsub[lptr]].r;
        dVar13 = dense[xlsub[lptr]].i;
        luptr2 = nrow * iVar9 + segsze + -1 + iVar8;
        ukj2.i = dense[xlsub[iVar10 + -2]].r;
        dVar14 = dense[xlsub[iVar10 + -2]].i;
        fsupc = luptr2 - nrow;
        if (jcolp1 == 2) {
          dVar12 = dVar12 - (ukj2.i * *(double *)(xlusup + (long)fsupc * 4) +
                            -(dVar14 * *(double *)(xlusup + (long)fsupc * 4 + 2)));
          dVar13 = dVar13 - (dVar14 * *(double *)(xlusup + (long)fsupc * 4) +
                            ukj2.i * *(double *)(xlusup + (long)fsupc * 4 + 2));
          iVar8 = xlsub[lptr];
          dense[iVar8].r = dVar12;
          dense[iVar8].i = dVar13;
          for (new_next = isub + segsze;
              new_next < *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4); new_next = new_next + 1)
          {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            dVar1 = *(double *)(xlusup + (long)luptr2 * 4);
            dVar2 = *(double *)(xlusup + (long)luptr2 * 4 + 2);
            dVar3 = *(double *)(xlusup + (long)fsupc * 4);
            dVar4 = *(double *)(xlusup + (long)fsupc * 4 + 2);
            dense[no_zeros].r =
                 dense[no_zeros].r -
                 (dVar12 * *(double *)(xlusup + (long)luptr2 * 4) +
                  -(dVar13 * *(double *)(xlusup + (long)luptr2 * 4 + 2)) +
                 ukj2.i * *(double *)(xlusup + (long)fsupc * 4) +
                 -(dVar14 * *(double *)(xlusup + (long)fsupc * 4 + 2)));
            dense[no_zeros].i =
                 dense[no_zeros].i -
                 (dVar13 * dVar1 + dVar12 * dVar2 + dVar14 * dVar3 + ukj2.i * dVar4);
          }
        }
        else {
          _luptr1 = dense[xlsub[iVar10 + -3]].r;
          ukj2.r = dense[xlsub[iVar10 + -3]].i;
          nsupc = fsupc - nrow;
          ukj2.i = ukj2.i - (_luptr1 * *(double *)(xlusup + (long)(nsupc + -1) * 4) +
                            -(ukj2.r * *(double *)(xlusup + (long)(nsupc + -1) * 4 + 2)));
          dVar14 = dVar14 - (ukj2.r * *(double *)(xlusup + (long)(nsupc + -1) * 4) +
                            _luptr1 * *(double *)(xlusup + (long)(nsupc + -1) * 4 + 2));
          dVar12 = dVar12 - (ukj2.i * *(double *)(xlusup + (long)fsupc * 4) +
                             -(dVar14 * *(double *)(xlusup + (long)fsupc * 4 + 2)) +
                            _luptr1 * *(double *)(xlusup + (long)nsupc * 4) +
                            -(ukj2.r * *(double *)(xlusup + (long)nsupc * 4 + 2)));
          dVar13 = dVar13 - (dVar14 * *(double *)(xlusup + (long)fsupc * 4) +
                             ukj2.i * *(double *)(xlusup + (long)fsupc * 4 + 2) +
                            ukj2.r * *(double *)(xlusup + (long)nsupc * 4) +
                            _luptr1 * *(double *)(xlusup + (long)nsupc * 4 + 2));
          iVar8 = xlsub[lptr];
          dense[iVar8].r = dVar12;
          dense[iVar8].i = dVar13;
          iVar8 = xlsub[iVar10 + -2];
          dense[iVar8].r = ukj2.i;
          dense[iVar8].i = dVar14;
          for (new_next = isub + segsze;
              new_next < *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4); new_next = new_next + 1)
          {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            nsupc = nsupc + 1;
            dVar1 = *(double *)(xlusup + (long)luptr2 * 4);
            dVar2 = *(double *)(xlusup + (long)luptr2 * 4 + 2);
            dVar3 = *(double *)(xlusup + (long)fsupc * 4);
            dVar4 = *(double *)(xlusup + (long)fsupc * 4 + 2);
            dVar5 = *(double *)(xlusup + (long)nsupc * 4);
            dVar6 = *(double *)(xlusup + (long)nsupc * 4 + 2);
            dense[no_zeros].r =
                 dense[no_zeros].r -
                 (dVar12 * *(double *)(xlusup + (long)luptr2 * 4) +
                  -(dVar13 * *(double *)(xlusup + (long)luptr2 * 4 + 2)) +
                  ukj2.i * *(double *)(xlusup + (long)fsupc * 4) +
                  -(dVar14 * *(double *)(xlusup + (long)fsupc * 4 + 2)) +
                 _luptr1 * *(double *)(xlusup + (long)nsupc * 4) +
                 -(ukj2.r * *(double *)(xlusup + (long)nsupc * 4 + 2)));
            dense[no_zeros].i =
                 dense[no_zeros].i -
                 (dVar13 * dVar1 + dVar12 * dVar2 + dVar14 * dVar3 + ukj2.i * dVar4 +
                 ukj2.r * dVar5 + _luptr1 * dVar6);
          }
        }
      }
      else {
        ufirst = local_240 - local_23c;
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          tempv[new_next].r = dense[no_zeros].r;
          tempv[new_next].i = dense[no_zeros].i;
          i = i + 1;
        }
        luptr2 = nrow * ufirst + ufirst + iVar8;
        zlsolve(nrow,jcolp1,(doublecomplex *)(xlusup + (long)luptr2 * 4),tempv);
        luptr2 = jcolp1 + luptr2;
        Mxvec = tempv + jcolp1;
        zmatvec(nrow,jsupno,jcolp1,(doublecomplex *)(xlusup + (long)luptr2 * 4),tempv,Mxvec);
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          dense[no_zeros].r = tempv[new_next].r;
          dense[no_zeros].i = tempv[new_next].i;
          tempv[new_next].r = one.i;
          tempv[new_next].i = zero.r;
          i = i + 1;
        }
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          dense[no_zeros].r = dense[no_zeros].r - Mxvec[new_next].r;
          dense[no_zeros].i = dense[no_zeros].i - Mxvec[new_next].i;
          Mxvec[new_next].r = one.i;
          Mxvec[new_next].i = zero.r;
          i = i + 1;
        }
      }
    }
  }
  d_fsupc = piStack_128[jcol];
  nsupr = supno[ksub];
  nextlu = (d_fsupc + *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4)) -
           *(int *)((long)&lusup->r + (long)nsupr * 4);
  while( true ) {
    if (nextlu <= tempv1._4_4_) {
      for (i = *(int_t *)((long)&lusup->r + (long)nsupr * 4);
          i < *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4); i = i + 1) {
        no_zeros = xlsub[i];
        *(double *)(xlusup + (long)d_fsupc * 4) = dense[no_zeros].r;
        *(double *)((long)(xlusup + (long)d_fsupc * 4) + 8) = dense[no_zeros].i;
        dense[no_zeros].r = one.i;
        dense[no_zeros].i = zero.r;
        d_fsupc = d_fsupc + 1;
      }
      piStack_128[k] = d_fsupc;
      if (fpanelc < nsupr) {
        local_244 = nsupr;
      }
      else {
        local_244 = fpanelc;
      }
      xsup._4_4_ = local_244;
      if (local_244 < jcol) {
        xsup._0_4_ = local_244 - nsupr;
        isub = *(int *)((long)&lusup->r + (long)nsupr * 4) + (int)xsup;
        luptr2 = piStack_128[local_244] + (int)xsup;
        nrow = *(int *)((long)&lusup->r + (long)(nsupr + 1) * 4) -
               *(int *)((long)&lusup->r + (long)nsupr * 4);
        segsze = jcol - local_244;
        jsupno = (nrow - (int)xsup) - segsze;
        fst_col = piStack_128[jcol] + (int)xsup;
        pfVar7[0x13] = (float)(segsze * 4 * (segsze + -1)) + pfVar7[0x13];
        pfVar7[0x14] = (float)(jsupno * 8 * segsze) + pfVar7[0x14];
        zlsolve(nrow,segsze,(doublecomplex *)(xlusup + (long)luptr2 * 4),
                (doublecomplex *)(xlusup + (long)fst_col * 4));
        zmatvec(nrow,jsupno,segsze,(doublecomplex *)(xlusup + (long)(luptr2 + segsze) * 4),
                (doublecomplex *)(xlusup + (long)fst_col * 4),tempv);
        i = fst_col + segsze;
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          *(double *)(xlusup + (long)i * 4) = *(double *)(xlusup + (long)i * 4) - tempv[new_next].r;
          *(double *)(xlusup + (long)i * 4 + 2) =
               *(double *)(xlusup + (long)i * 4 + 2) - tempv[new_next].i;
          tempv[new_next].r = one.i;
          tempv[new_next].i = zero.r;
          i = i + 1;
        }
      }
      return 0;
    }
    iVar11 = zLUMemXpand(jcol,d_fsupc,LUSUP,(int_t *)((long)&tempv1 + 4),Glu);
    if (iVar11 != 0) break;
    xlusup = (int_t *)Glu->lusup;
    xlsub = Glu->lsub;
  }
  return iVar11;
}

Assistant:

int
zcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     doublecomplex     *dense,	  /* in */
	     doublecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    doublecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    doublecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    doublecomplex       *tempv1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      none = {-1.0, 0.0};
    doublecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += 4 * segsze * (segsze - 1);
	    ops[GEMV] += 8 * nrow * segsze;



	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		    z_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    z_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    z_sub(&ukj1, &ukj1, &comp_temp);

		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    z_add(&comp_temp, &comp_temp, &comp_temp1);
		    z_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		zlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		zmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    z_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (doublecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}